

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

int aom_vector_setup(Vector *vector,size_t capacity,size_t element_size)

{
  void *pvVar1;
  long in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  ulong local_28;
  int local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = -1;
  }
  else {
    *in_RDI = 0;
    local_28 = in_RSI;
    if (in_RSI < 2) {
      local_28 = 2;
    }
    in_RDI[1] = local_28;
    in_RDI[2] = in_RDX;
    pvVar1 = malloc(in_RDI[1] * in_RDX);
    in_RDI[3] = pvVar1;
    local_4 = 0;
    if (in_RDI[3] == 0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int aom_vector_setup(Vector *vector, size_t capacity, size_t element_size) {
  assert(vector != NULL);

  if (vector == NULL) return VECTOR_ERROR;

  vector->size = 0;
  vector->capacity = MAX(VECTOR_MINIMUM_CAPACITY, capacity);
  vector->element_size = element_size;
  vector->data = malloc(vector->capacity * element_size);

  return vector->data == NULL ? VECTOR_ERROR : VECTOR_SUCCESS;
}